

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

uint tryfuncTM(lua_State *L,StkId func,uint status)

{
  TValue *pTVar1;
  TValue *io1;
  StkId pSVar2;
  TValue *io1_1;
  
  pTVar1 = luaT_gettmbyobj(L,&func->val,TM_CALL);
  if ((pTVar1->tt_ & 0xf) == 0) {
    luaG_callerror(L,&func->val);
  }
  pSVar2 = (L->top).p;
  if (func < pSVar2) {
    do {
      (pSVar2->val).value_ = pSVar2[-1].val.value_;
      (pSVar2->val).tt_ = *(lu_byte *)((long)pSVar2 - 8);
      pSVar2 = pSVar2 + -1;
    } while (func < pSVar2);
    pSVar2 = (StkId)(L->top).offset;
  }
  (L->top).p = pSVar2 + 1;
  (func->val).value_ = pTVar1->value_;
  (func->val).tt_ = pTVar1->tt_;
  if ((~status & 0xf00) != 0) {
    return status + 0x100;
  }
  luaG_runerror(L,"\'__call\' chain too long");
}

Assistant:

static unsigned tryfuncTM (lua_State *L, StkId func, unsigned status) {
  const TValue *tm;
  StkId p;
  tm = luaT_gettmbyobj(L, s2v(func), TM_CALL);
  if (l_unlikely(ttisnil(tm)))  /* no metamethod? */
    luaG_callerror(L, s2v(func));
  for (p = L->top.p; p > func; p--)  /* open space for metamethod */
    setobjs2s(L, p, p-1);
  L->top.p++;  /* stack space pre-allocated by the caller */
  setobj2s(L, func, tm);  /* metamethod is the new function to be called */
  if ((status & MAX_CCMT) == MAX_CCMT)  /* is counter full? */
    luaG_runerror(L, "'__call' chain too long");
  return status + (1u << CIST_CCMT);  /* increment counter */
}